

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmberImproperTorsionType.hpp
# Opt level: O0

void __thiscall
OpenMD::AmberImproperTorsionType::AmberImproperTorsionType
          (AmberImproperTorsionType *this,RealType v2)

{
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  RealType c2;
  RealType c0;
  PolynomialInversionType *in_stack_ffffffffffffffd0;
  PolynomialInversionType *in_stack_ffffffffffffffe0;
  
  PolynomialInversionType::PolynomialInversionType(in_stack_ffffffffffffffe0);
  *in_RDI = &PTR__AmberImproperTorsionType_00565010;
  in_RDI[7] = in_XMM0_Qa;
  PolynomialInversionType::setCoefficient
            (in_stack_ffffffffffffffd0,(int)((ulong)in_RDI >> 0x20),2.068082707382e-317);
  PolynomialInversionType::setCoefficient
            (in_stack_ffffffffffffffd0,(int)((ulong)in_RDI >> 0x20),2.06809357682621e-317);
  return;
}

Assistant:

AmberImproperTorsionType(RealType v2) : PolynomialInversionType(), v2_(v2) {
      // convert AmberImproper Torsion Type to Polynomial Inversion type
      RealType c0 = v2;
      RealType c2 = -v2;

      setCoefficient(0, c0);
      setCoefficient(2, c2);
    }